

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utf8Utils.c
# Opt level: O0

int XConvertUcsToUtf8(uint ucs,char *buf)

{
  byte bVar1;
  char *buf_local;
  uint ucs_local;
  
  bVar1 = (byte)ucs;
  if (ucs < 0x80) {
    *buf = bVar1;
    buf_local._4_4_ = 1;
  }
  else if (ucs < 0x800) {
    *buf = (byte)(ucs >> 6) | 0xc0;
    buf[1] = bVar1 & 0x3f | 0x80;
    buf_local._4_4_ = 2;
  }
  else if (ucs < 0x10000) {
    *buf = (byte)(ucs >> 0xc) | 0xe0;
    buf[1] = (byte)(ucs >> 6) & 0x3f | 0x80;
    buf[2] = bVar1 & 0x3f | 0x80;
    buf_local._4_4_ = 3;
  }
  else if (ucs < 0x200000) {
    *buf = (byte)(ucs >> 0x12) | 0xf0;
    buf[1] = (byte)(ucs >> 0xc) & 0x3f | 0x80;
    buf[2] = (byte)(ucs >> 6) & 0x3f | 0x80;
    buf[3] = bVar1 & 0x3f | 0x80;
    buf_local._4_4_ = 4;
  }
  else if (ucs < 0x1000000) {
    *buf = (byte)(ucs >> 0x18) | 0xf8;
    buf[1] = (byte)(ucs >> 0x12) & 0x3f | 0x80;
    buf[2] = (byte)(ucs >> 0xc) & 0x3f | 0x80;
    buf[3] = (byte)(ucs >> 6) & 0x3f | 0x80;
    buf[4] = bVar1 & 0x3f | 0x80;
    buf_local._4_4_ = 5;
  }
  else {
    *buf = '?';
    buf_local._4_4_ = -1;
  }
  return buf_local._4_4_;
}

Assistant:

int 
XConvertUcsToUtf8(unsigned int 	ucs, 
		  char 		*buf) {

  if (ucs < 0x000080) {
    buf[0] = ucs;
    return 1;
  } else if (ucs < 0x000800) {
    buf[0] = 0xC0 | (ucs >> 6);
    buf[1] = 0x80 | (ucs & 0x3F);
    return 2;
  } else if (ucs < 0x010000) { 
    buf[0] = 0xE0 | (ucs >> 12);
    buf[1] = 0x80 | ((ucs >> 6) & 0x3F);
    buf[2] = 0x80 | (ucs & 0x3F);
    return 3;
  } else if (ucs < 0x00200000) {
    buf[0] = 0xF0 | (ucs >> 18);
    buf[1] = 0x80 | ((ucs >> 12) & 0x3F);
    buf[2] = 0x80 | ((ucs >> 6) & 0x3F);
    buf[3] = 0x80 | (ucs & 0x3F);
    return 4;
  } else if (ucs < 0x01000000) {
    buf[0] = 0xF8 | (ucs >> 24);
    buf[1] = 0x80 | ((ucs >> 18) & 0x3F);
    buf[2] = 0x80 | ((ucs >> 12) & 0x3F);
    buf[3] = 0x80 | ((ucs >> 6) & 0x3F);
    buf[4] = 0x80 | (ucs & 0x3F);
    return 5;
  }
  buf[0] = '?';
  return -1;
}